

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worn.c
# Opt level: O0

void m_dowear(level *lev,monst *mon,boolean creation)

{
  boolean bVar1;
  boolean creation_local;
  monst *mon_local;
  level *lev_local;
  
  if ((((mon->data->msize != '\0') && ((mon->data->mflags1 & 0x2000) == 0)) &&
      ((mon->data->mflags1 & 0x40000) == 0)) &&
     (((mon->data->mflags1 & 0x10000) == 0 ||
      ((creation != '\0' && ((mon->data->mlet == '\'' || (mon->data == mons + 0xfe)))))))) {
    m_dowear_type(lev,mon,0x10000,creation,'\0');
    bVar1 = breakarm(mon->data);
    if (((bVar1 == '\0') && (bVar1 = sliparm(mon->data), bVar1 == '\0')) ||
       ((mon->misc_worn_check & 1U) != 0)) {
      m_dowear_type(lev,mon,0x40,creation,'\0');
    }
    bVar1 = breakarm(mon->data);
    if (((bVar1 == '\0') && (bVar1 = sliparm(mon->data), bVar1 == '\0')) ||
       (mon->data->msize == '\x01')) {
      m_dowear_type(lev,mon,2,creation,'\0');
    }
    m_dowear_type(lev,mon,4,creation,'\0');
    if ((mon->mw == (obj *)0x0) ||
       ((((mon->mw->oclass != '\x02' && (mon->mw->oclass != '\x06')) ||
         ((*(ushort *)&objects[mon->mw->otyp].field_0x11 & 1) == 0)) || (mon->data == mons + 0x11b))
       )) {
      m_dowear_type(lev,mon,8,creation,'\0');
    }
    m_dowear_type(lev,mon,0x10,creation,'\0');
    if (((mon->data->mflags1 & 0x80000) == 0) && (mon->data->mlet != '\x1d')) {
      m_dowear_type(lev,mon,0x20,creation,'\0');
    }
    bVar1 = breakarm(mon->data);
    if ((bVar1 == '\0') && (bVar1 = sliparm(mon->data), bVar1 == '\0')) {
      m_dowear_type(lev,mon,1,creation,'\0');
    }
    else {
      m_dowear_type(lev,mon,1,creation,'\x01');
    }
  }
  return;
}

Assistant:

void m_dowear(struct level *lev, struct monst *mon, boolean creation)
{
#define RACE_EXCEPTION TRUE
	/* Note the restrictions here are the same as in dowear in do_wear.c
	 * except for the additional restriction on intelligence.  (Players
	 * are always intelligent, even if polymorphed).
	 */
	if (verysmall(mon->data) || nohands(mon->data) || is_animal(mon->data))
		return;
	/* give mummies a chance to wear their wrappings
	 * and let skeletons wear their initial armor */
	if (mindless(mon->data) && (!creation ||
	    (mon->data->mlet != S_MUMMY && mon->data != &mons[PM_SKELETON])))
		return;

	m_dowear_type(lev, mon, W_AMUL, creation, FALSE);
	/* can't put on shirt if already wearing suit */
	if (!cantweararm(mon->data) || (mon->misc_worn_check & W_ARM))
	    m_dowear_type(lev, mon, W_ARMU, creation, FALSE);
	/* treating small as a special case allows
	   hobbits, gnomes, and kobolds to wear cloaks */
	if (!cantweararm(mon->data) || mon->data->msize == MZ_SMALL)
	    m_dowear_type(lev, mon, W_ARMC, creation, FALSE);
	m_dowear_type(lev, mon, W_ARMH, creation, FALSE);
	/* Black Marketeer can use a shield even with two-handed Thiefbane. */
	if (!MON_WEP(mon) || !bimanual(MON_WEP(mon)) ||
	    mon->data == &mons[PM_BLACK_MARKETEER])
	    m_dowear_type(lev, mon, W_ARMS, creation, FALSE);
	m_dowear_type(lev, mon, W_ARMG, creation, FALSE);
	if (!slithy(mon->data) && mon->data->mlet != S_CENTAUR)
	    m_dowear_type(lev, mon, W_ARMF, creation, FALSE);
	if (!cantweararm(mon->data))
	    m_dowear_type(lev, mon, W_ARM, creation, FALSE);
	else
	    m_dowear_type(lev, mon, W_ARM, creation, RACE_EXCEPTION);
}